

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

Constraint * __thiscall
slang::ast::ConstraintBlockSymbol::getConstraints(ConstraintBlockSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  Symbol *pSVar3;
  Scope *scope;
  size_t sVar4;
  undefined1 auVar5 [16];
  long lVar6;
  DiagCode DVar7;
  int iVar8;
  Diagnostic *pDVar9;
  undefined4 extraout_var;
  SourceLocation SVar10;
  Diagnostic *this_00;
  long lVar11;
  InvalidConstraint *pIVar12;
  socklen_t __len;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  byte bVar13;
  DiagCode code;
  long lVar14;
  SourceRange sourceRange;
  bitmask<slang::ast::ConstraintBlockFlags> declFlags;
  ASTContext context;
  bitmask<slang::ast::ConstraintBlockFlags> local_91;
  Token local_90;
  tuple<const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*> local_80;
  Scope *local_68;
  char local_60 [8];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (this->constraint != (Constraint *)0x0) {
    return this->constraint;
  }
  pSVar1 = (this->super_Symbol).parentScope;
  pSVar2 = (this->super_Symbol).originatingSyntax;
  local_68 = &this->super_Scope;
  __len = 0xffffffff;
  local_60[0] = -1;
  local_60[1] = -1;
  local_60[2] = -1;
  local_60[3] = -1;
  local_38 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  if (pSVar2->kind == ConstraintPrototype) {
    pSVar3 = pSVar1->thisSym;
    scope = pSVar3->parentScope;
    Compilation::findOutOfBlockDecl
              (&local_80,scope->compilation,scope,pSVar3->name,(this->super_Symbol).name);
    sVar4 = (this->super_Symbol).name._M_len;
    if ((local_80.
         super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>.
         super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl ==
         (SyntaxNode *)0x0) ||
       (sVar4 == 0 ||
        (local_80.
         super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>.
         super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl)->kind !=
        ConstraintDeclaration)) {
      bVar13 = (this->flags).m_bits;
      if (sVar4 != 0 && (bVar13 & 2) == 0) {
        DVar7.subsystem = Declarations;
        DVar7.code = 0xf5;
        code.subsystem = Declarations;
        code.code = 0x8b;
        if ((bVar13 & 0x10) == 0) {
          code = DVar7;
        }
        pDVar9 = Scope::addDiag(scope,code,(this->super_Symbol).location);
        Diagnostic::operator<<(pDVar9,(this->super_Symbol).name);
      }
    }
    else {
      *(bool *)local_80.
               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
               .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
               super__Tuple_impl<2UL,_bool_*>.super__Head_base<2UL,_bool_*,_false>._M_head_impl =
           true;
      if (((this->flags).m_bits & 2) == 0) {
        this->outOfBlockIndex =
             local_80.
             super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
             .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
             super__Head_base<1UL,_slang::ast::SymbolIndex,_false>._M_head_impl;
        if (local_80.
            super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
            .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
            super__Head_base<1UL,_slang::ast::SymbolIndex,_false>._M_head_impl <=
            pSVar3->indexInScope) {
          local_90 = slang::syntax::SyntaxNode::getLastToken
                               (local_80.
                                super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                                _M_head_impl[8].previewNode);
          SVar10 = parsing::Token::location(&local_90);
          pDVar9 = Scope::addDiag(scope,(DiagCode)0x6e0006,SVar10);
          this_00 = Diagnostic::operator<<(pDVar9,(this->super_Symbol).name);
          Diagnostic::operator<<(this_00,pSVar3->name);
          Diagnostic::addNote(pDVar9,(DiagCode)0x50001,pSVar3->location);
        }
        lVar11 = (long)local_80.
                       super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                       .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl
                       [5].parent << 4;
        lVar6 = 0;
        do {
          lVar14 = lVar6;
          if (lVar11 == lVar14) break;
          lVar6 = lVar14 + 0x10;
        } while (*(short *)(*(long *)(local_80.
                                      super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                      .
                                      super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>
                                      ._M_head_impl + 5) + lVar14) != 0x11c);
        bVar13 = (this->flags).m_bits;
        if ((lVar11 != lVar14) != (bool)((bVar13 & 4) >> 2)) {
          local_90 = slang::syntax::SyntaxNode::getFirstToken
                               (local_80.
                                super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                                _M_head_impl);
          SVar10 = parsing::Token::location(&local_90);
          pDVar9 = Scope::addDiag(scope,(DiagCode)0x790006,SVar10);
          Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(this->super_Symbol).location);
          bVar13 = (this->flags).m_bits;
        }
        local_91.m_bits = 0;
        addSpecifierFlags((SyntaxList<slang::syntax::ClassSpecifierSyntax> *)
                          &local_80.
                           super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                           .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                           _M_head_impl[6].parent,&local_91);
        __len = extraout_EDX;
        if (local_91.m_bits != (bVar13 & 0xe0)) {
          local_90 = slang::syntax::SyntaxNode::getLastToken
                               (local_80.
                                super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                                _M_head_impl[8].previewNode);
          SVar10 = parsing::Token::location(&local_90);
          pDVar9 = Scope::addDiag(scope,(DiagCode)0x780006,SVar10);
          Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(this->super_Symbol).location);
          __len = extraout_EDX_00;
        }
        iVar8 = (int)*(undefined8 *)
                      (local_80.
                       super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                       .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl
                      + 9);
        goto LAB_0064ac0d;
      }
      sourceRange = slang::syntax::SyntaxNode::sourceRange
                              (local_80.
                               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                               .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                               _M_head_impl[8].previewNode);
      pDVar9 = Scope::addDiag(scope,(DiagCode)0xd0006,sourceRange);
      Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(this->super_Symbol).location);
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_90.info;
    local_90 = (Token)(auVar5 << 0x40);
    pIVar12 = BumpAllocator::emplace<slang::ast::InvalidConstraint,decltype(nullptr)>
                        (&pSVar1->compilation->super_BumpAllocator,(void **)&local_90);
  }
  else {
    iVar8 = (int)*(undefined8 *)(pSVar2 + 9);
LAB_0064ac0d:
    iVar8 = Constraint::bind(iVar8,(sockaddr *)&local_68,__len);
    pIVar12 = (InvalidConstraint *)CONCAT44(extraout_var,iVar8);
  }
  this->constraint = &pIVar12->super_Constraint;
  return &pIVar12->super_Constraint;
}

Assistant:

const Constraint& ConstraintBlockSymbol::getConstraints() const {
    if (constraint)
        return *constraint;

    auto syntax = getSyntax();
    auto scope = getParentScope();
    SLANG_ASSERT(syntax && scope);
    ASTContext context(*this, LookupLocation::max);

    if (syntax->kind == SyntaxKind::ConstraintPrototype) {
        // The out-of-block definition must be in our parent scope.
        auto& parentSym = scope->asSymbol();
        auto& outerScope = *parentSym.getParentScope();
        auto& comp = outerScope.getCompilation();

        auto [declSyntax, index, used] = comp.findOutOfBlockDecl(outerScope, parentSym.name, name);
        if (!declSyntax || declSyntax->kind != SyntaxKind::ConstraintDeclaration || name.empty()) {
            if (!flags.has(ConstraintBlockFlags::Pure) && !name.empty()) {
                DiagCode code = flags.has(ConstraintBlockFlags::ExplicitExtern)
                                    ? diag::NoMemberImplFound
                                    : diag::NoConstraintBody;
                outerScope.addDiag(code, location) << name;
            }
            constraint = scope->getCompilation().emplace<InvalidConstraint>(nullptr);
            return *constraint;
        }

        auto& cds = declSyntax->as<ConstraintDeclarationSyntax>();
        *used = true;

        if (flags.has(ConstraintBlockFlags::Pure)) {
            auto& diag = outerScope.addDiag(diag::BodyForPureConstraint, cds.name->sourceRange());
            diag.addNote(diag::NoteDeclarationHere, location);
            constraint = scope->getCompilation().emplace<InvalidConstraint>(nullptr);
            return *constraint;
        }

        // The method definition must be located after the class definition.
        outOfBlockIndex = index;
        if (index <= parentSym.getIndex()) {
            auto& diag = outerScope.addDiag(diag::MemberDefinitionBeforeClass,
                                            cds.name->getLastToken().location());
            diag << name << parentSym.name;
            diag.addNote(diag::NoteDeclarationHere, parentSym.location);
        }

        bool declStatic = false;
        for (auto qual : cds.qualifiers) {
            if (qual.kind == TokenKind::StaticKeyword) {
                declStatic = true;
                break;
            }
        }

        if (declStatic != flags.has(ConstraintBlockFlags::Static)) {
            auto& diag = outerScope.addDiag(diag::MismatchStaticConstraint,
                                            cds.getFirstToken().location());
            diag.addNote(diag::NoteDeclarationHere, location);
        }

        bitmask<ConstraintBlockFlags> declFlags;
        addSpecifierFlags(cds.specifiers, declFlags);

        if (declFlags != (flags & (ConstraintBlockFlags::Initial | ConstraintBlockFlags::Extends |
                                   ConstraintBlockFlags::Final))) {
            auto& diag = outerScope.addDiag(diag::MismatchConstraintSpecifiers,
                                            cds.name->getLastToken().location());
            diag.addNote(diag::NoteDeclarationHere, location);
        }

        constraint = &Constraint::bind(*cds.block, context);
        return *constraint;
    }

    constraint = &Constraint::bind(*syntax->as<ConstraintDeclarationSyntax>().block, context);
    return *constraint;
}